

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexTextureTests.cpp
# Opt level: O2

float deqp::gles3::Functional::safeCoord(float raw,int scale,float fraction)

{
  float __x;
  float fVar1;
  
  __x = (raw * (float)scale + 0.5) - fraction;
  fVar1 = floorf(__x);
  return (fVar1 + (__x - fVar1) * 0.5 + 0.25 + -0.5 + fraction) / (float)scale;
}

Assistant:

static inline float safeCoord (float raw, int scale, float fraction)
{
	const float scaleFloat = (float)scale;
	return moveTowardsFraction(raw*scaleFloat, fraction) / scaleFloat;
}